

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_noise_estimate.c
# Opt level: O0

void av1_noise_estimate_init(NOISE_ESTIMATE *ne,int width,int height)

{
  long lVar1;
  int64_t area;
  int height_local;
  int width_local;
  NOISE_ESTIMATE *ne_local;
  
  lVar1 = (long)width * (long)height;
  ne->enabled = 0;
  ne->level = (uint)(0xe0fff < lVar1);
  ne->value = 0;
  ne->count = 0;
  ne->thresh = 0x5a;
  ne->last_w = 0;
  ne->last_h = 0;
  if (lVar1 < 0x1fa400) {
    if (lVar1 < 0xe1000) {
      if (0x383ff < lVar1) {
        ne->thresh = 0x73;
      }
    }
    else {
      ne->thresh = 0x8c;
    }
  }
  else {
    ne->thresh = 200;
  }
  ne->num_frames_estimate = 0xf;
  ne->adapt_thresh = ne->thresh * 3 >> 1;
  return;
}

Assistant:

void av1_noise_estimate_init(NOISE_ESTIMATE *const ne, int width, int height) {
  const int64_t area = (int64_t)width * height;
  ne->enabled = 0;
  ne->level = (area < 1280 * 720) ? kLowLow : kLow;
  ne->value = 0;
  ne->count = 0;
  ne->thresh = 90;
  ne->last_w = 0;
  ne->last_h = 0;
  if (area >= 1920 * 1080) {
    ne->thresh = 200;
  } else if (area >= 1280 * 720) {
    ne->thresh = 140;
  } else if (area >= 640 * 360) {
    ne->thresh = 115;
  }
  ne->num_frames_estimate = 15;
  ne->adapt_thresh = (3 * ne->thresh) >> 1;
}